

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test::testBody
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test *this)

{
  MemoryLeakDetector *pMVar1;
  SimpleString *pSVar2;
  bool bVar3;
  TestMemoryAllocator *pTVar4;
  char *memory;
  UtestShell *pUVar5;
  TestTerminator *pTVar6;
  SimpleString SStack_38;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar4 = defaultNewArrayAllocator();
  memory = MemoryLeakDetector::allocMemory(pMVar1,pTVar4,100,"ALLOC.c",10,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar4 = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar4,memory,"FREE.c",100,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&SStack_38,"Allocation/deallocation type mismatch");
  bVar3 = SimpleString::contains(pSVar2,&SStack_38);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"Allocation/deallocation type mismatch\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x180,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString
            (&SStack_38,"   allocated at file: ALLOC.c line: 10 size: 100 type: new []");
  bVar3 = SimpleString::contains(pSVar2,&SStack_38);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"   allocated at file: ALLOC.c line: 10 size: 100 type: new []\")"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x181,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&SStack_38,"   deallocated at file: FREE.c line: 100 type: free");
  bVar3 = SimpleString::contains(pSVar2,&SStack_38);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"   deallocated at file: FREE.c line: 100 type: free\")",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x182,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherType)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Allocation/deallocation type mismatch"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 100 type: new []"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}